

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteObject(ON_BinaryArchive *this,ON_Object *model_object)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_NurbsCurve *pOVar4;
  ON_NurbsSurface *pOVar5;
  ON_Extrusion *this_00;
  undefined4 extraout_var;
  ON_Annotation *V6_annotation_00;
  ON_OBSOLETE_V5_Annotation *V5_annotation_00;
  wchar_t *s;
  ON_3dPoint local_158;
  undefined1 local_140 [8];
  ON_OBSOLETE_V2_TextDot V2_text_dot;
  ON_TextDot *text_dot;
  ON_OBSOLETE_V5_Annotation *V5_annotation;
  ON_Annotation *V6_annotation;
  ON_SumSurface *pOStack_f0;
  bool rc;
  ON_Object *V4_object;
  ON_Extrusion *extrusion;
  ON_NurbsSurface nurbs_surface;
  ON_Surface *surface;
  undefined1 local_70 [8];
  ON_NurbsCurve nurbs_curve;
  ON_Curve *curve;
  object_type model_object_type;
  ON_Object *model_object_local;
  ON_BinaryArchive *this_local;
  
  if ((this->m_3dm_version < 1) || (0x32 < this->m_3dm_version)) goto LAB_00494767;
  iVar2 = (*model_object->_vptr_ON_Object[0xc])();
  if (iVar2 == 4) {
    if (((2 < this->m_3dm_version) ||
        (nurbs_curve.m_cv = (double *)model_object, model_object == (ON_Object *)0x0)) ||
       (pOVar4 = ON_NurbsCurve::Cast(model_object), pOVar4 != (ON_NurbsCurve *)0x0))
    goto LAB_00494767;
    ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_70);
    iVar2 = (**(code **)((long)*nurbs_curve.m_cv + 0x1f8))
                      (0,nurbs_curve.m_cv,(ON_NurbsCurve *)local_70,0);
    if ((iVar2 == 0) || (iVar2 = ON_NurbsCurve::Order((ON_NurbsCurve *)local_70), iVar2 < 2)) {
LAB_004942ae:
      bVar1 = false;
    }
    else {
      iVar2 = ON_NurbsCurve::CVCount((ON_NurbsCurve *)local_70);
      iVar3 = ON_NurbsCurve::Order((ON_NurbsCurve *)local_70);
      if ((iVar2 < iVar3) ||
         (iVar2 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)local_70), iVar2 < 1))
      goto LAB_004942ae;
      this_local._7_1_ = Internal_WriteObject(this,(ON_Object *)local_70);
      bVar1 = true;
    }
    ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_70);
    if (bVar1) goto LAB_0049477c;
  }
  else if (iVar2 == 8) {
    if (((this->m_3dm_version < 3) &&
        (nurbs_surface.m_cv = (double *)model_object, model_object != (ON_Object *)0x0)) &&
       (pOVar5 = ON_NurbsSurface::Cast(model_object), pOVar5 == (ON_NurbsSurface *)0x0)) {
      ON_NurbsSurface::ON_NurbsSurface((ON_NurbsSurface *)&extrusion);
      iVar2 = (**(code **)((long)*nurbs_surface.m_cv + 0x1e0))(0);
      if (((iVar2 == 0) ||
          (iVar2 = ON_NurbsSurface::Order((ON_NurbsSurface *)&extrusion,0), iVar2 < 2)) ||
         (iVar2 = ON_NurbsSurface::Order((ON_NurbsSurface *)&extrusion,1), iVar2 < 2)) {
LAB_0049448e:
        bVar1 = false;
      }
      else {
        iVar2 = ON_NurbsSurface::CVCount((ON_NurbsSurface *)&extrusion,0);
        iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)&extrusion,0);
        if (iVar2 < iVar3) goto LAB_0049448e;
        iVar2 = ON_NurbsSurface::CVCount((ON_NurbsSurface *)&extrusion,1);
        iVar3 = ON_NurbsSurface::Order((ON_NurbsSurface *)&extrusion,1);
        if ((iVar2 < iVar3) ||
           (iVar2 = ON_NurbsSurface::Dimension((ON_NurbsSurface *)&extrusion), iVar2 < 1))
        goto LAB_0049448e;
        this_local._7_1_ = Internal_WriteObject(this,(ON_Object *)&extrusion);
        bVar1 = true;
      }
      ON_NurbsSurface::~ON_NurbsSurface((ON_NurbsSurface *)&extrusion);
      if (bVar1) goto LAB_0049477c;
    }
  }
  else if (iVar2 == 0x200) {
    V6_annotation_00 = ON_Annotation::Cast(model_object);
    if (V6_annotation_00 != (ON_Annotation *)0x0) {
      this_local._7_1_ =
           Internal_WriteV5AnnotationObject(this,V6_annotation_00,(ON_3dmAnnotationContext *)0x0);
      goto LAB_0049477c;
    }
    if ((this->m_3dm_version < 3) &&
       (V5_annotation_00 = ON_OBSOLETE_V5_Annotation::Cast(model_object),
       V5_annotation_00 != (ON_OBSOLETE_V5_Annotation *)0x0)) {
      this_local._7_1_ =
           Internal_WriteV2AnnotationObject(this,V5_annotation_00,(ON_3dmAnnotationContext *)0x0);
      goto LAB_0049477c;
    }
  }
  else if (iVar2 == 0x2000) {
    if (this->m_3dm_version < 3) {
      V2_text_dot.m_text.m_s = (wchar_t *)ON_TextDot::Cast(model_object);
      if ((ON_TextDot *)V2_text_dot.m_text.m_s != (ON_TextDot *)0x0) {
        ON_OBSOLETE_V2_TextDot::ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)local_140);
        ON_TextDot::CenterPoint(&local_158,(ON_TextDot *)V2_text_dot.m_text.m_s);
        V2_text_dot.super_ON_Point.point.y = local_158.z;
        V2_text_dot.super_ON_Point.super_ON_Geometry.super_ON_Object.m_userdata_list =
             (ON_UserData *)local_158.x;
        V2_text_dot.super_ON_Point.point.x = local_158.y;
        s = ON_TextDot::PrimaryText(V2_text_dot.m_text.m_s);
        ON_wString::operator=((ON_wString *)&V2_text_dot.super_ON_Point.point.z,s);
        this_local._7_1_ = Internal_WriteObject(this,(ON_Object *)local_140);
        ON_OBSOLETE_V2_TextDot::~ON_OBSOLETE_V2_TextDot((ON_OBSOLETE_V2_TextDot *)local_140);
        goto LAB_0049477c;
      }
      V2_text_dot.m_text.m_s = (wchar_t *)0x0;
    }
  }
  else if (((iVar2 == 0x40000000) && (this->m_3dm_version < 5)) &&
          (this_00 = ON_Extrusion::Cast(model_object), this_00 != (ON_Extrusion *)0x0)) {
    pOStack_f0 = (ON_SumSurface *)0x0;
    iVar2 = ON_Extrusion::IsCapped(this_00);
    if ((iVar2 != 0) || (iVar2 = ON_Extrusion::ProfileCount(this_00), 1 < iVar2)) {
      iVar2 = (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x21])
                        (this_00,0);
      pOStack_f0 = (ON_SumSurface *)CONCAT44(extraout_var,iVar2);
    }
    if (pOStack_f0 == (ON_SumSurface *)0x0) {
      if (3 < this->m_3dm_version) {
        pOStack_f0 = ON_Extrusion::SumSurfaceForm(this_00,(ON_SumSurface *)0x0);
      }
      if (pOStack_f0 == (ON_SumSurface *)0x0) {
        pOStack_f0 = (ON_SumSurface *)
                     ON_Surface::NurbsSurface
                               (&this_00->super_ON_Surface,(ON_NurbsSurface *)0x0,0.0,
                                (ON_Interval *)0x0,(ON_Interval *)0x0);
      }
      if (pOStack_f0 == (ON_SumSurface *)0x0) goto LAB_00494767;
    }
    this_local._7_1_ = Internal_WriteObject(this,(ON_Object *)pOStack_f0);
    if (pOStack_f0 != (ON_SumSurface *)0x0) {
      (*(pOStack_f0->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    goto LAB_0049477c;
  }
LAB_00494767:
  this_local._7_1_ = Internal_WriteObject(this,model_object);
LAB_0049477c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
ON_BinaryArchive::WriteObject( const ON_Object& model_object )
{
  // writes polymorphic object derived from ON_Object in a way that
  // it can be recreated from ON_BinaryArchive::ReadObject

  if ( m_3dm_version >= 1 && m_3dm_version <= 50 )
  {
    const ON::object_type model_object_type = model_object.ObjectType();
    switch (model_object_type)
    {
    case ON::object_type::curve_object:
      {
        if (m_3dm_version > 2)
          break;
        const ON_Curve* curve = static_cast<const ON_Curve*>(&model_object);
        if (nullptr == curve)
          break;
        if (nullptr != ON_NurbsCurve::Cast(curve))
          break;
        ON_NurbsCurve nurbs_curve;
        if (curve->GetNurbForm(nurbs_curve)
          && nurbs_curve.Order() >= 2
          && nurbs_curve.CVCount() >= nurbs_curve.Order()
          && nurbs_curve.Dimension() >= 1
          )
        {
          return Internal_WriteObject(nurbs_curve);
        }
      }
      break;

    case ON::object_type::surface_object:
      {
        if (m_3dm_version > 2)
          break;
        const ON_Surface* surface = static_cast<const ON_Surface*>(&model_object);
        if (nullptr == surface)
          break;
        if (nullptr != ON_NurbsSurface::Cast(surface))
          break;
        ON_NurbsSurface nurbs_surface;
        if (surface->GetNurbForm(nurbs_surface)
          && nurbs_surface.Order(0) >= 2
          && nurbs_surface.Order(1) >= 2
          && nurbs_surface.CVCount(0) >= nurbs_surface.Order(0)
          && nurbs_surface.CVCount(1) >= nurbs_surface.Order(1)
          && nurbs_surface.Dimension() >= 1
          )
        {
          return Internal_WriteObject(nurbs_surface);
        }
      }
      break;

    case ON::extrusion_object:
      {
        if (m_3dm_version > 4)
          break;
        // 29 September 2010 Dale Lear
        //   ON_Extrusion was added in V5.  It must be translated
        //   to a brep or surface to save it in a V4 file.
        const ON_Extrusion* extrusion = ON_Extrusion::Cast(&model_object);
        if (nullptr == extrusion)
          break;
        ON_Object* V4_object = nullptr;
        if (extrusion->IsCapped() || extrusion->ProfileCount() >= 2)
          V4_object = extrusion->BrepForm(0);
        if (nullptr == V4_object)
        {
          if (m_3dm_version >= 4)
            V4_object = extrusion->SumSurfaceForm(0);
          if (nullptr == V4_object)
            V4_object = extrusion->NurbsSurface(0);
          if (nullptr == V4_object)
            break;
        }
        const bool rc = Internal_WriteObject(*V4_object);
        delete V4_object;
        return rc;
      }
      break;

    case ON::annotation_object:
      {
        const ON_Annotation* V6_annotation = ON_Annotation::Cast(&model_object);
        if (nullptr != V6_annotation)
          return Internal_WriteV5AnnotationObject(*V6_annotation, nullptr);
        if (m_3dm_version > 2)
          break;

        const ON_OBSOLETE_V5_Annotation* V5_annotation = ON_OBSOLETE_V5_Annotation::Cast(&model_object);
        if (nullptr != V5_annotation)
          return Internal_WriteV2AnnotationObject(*V5_annotation, nullptr);
      }
      break;

    case ON::object_type::text_dot:
      {
        if (m_3dm_version > 2)
          break;
        const ON_TextDot* text_dot = ON_TextDot::Cast(&model_object);
        if (nullptr == text_dot)
          break;
        ON_OBSOLETE_V2_TextDot V2_text_dot;
        V2_text_dot.point = text_dot->CenterPoint();
        V2_text_dot.m_text = text_dot->PrimaryText();
        return Internal_WriteObject(V2_text_dot);
      }
      break;
    default:
      break;
    }
  }
  
  return Internal_WriteObject(model_object);
}